

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

string * __thiscall cmList::append(cmList *this,string *list,string_view value)

{
  string *psVar1;
  allocator<char> local_41;
  string local_40;
  cmList *local_20;
  string *list_local;
  string_view value_local;
  
  value_local._M_len = value._M_len;
  local_20 = this;
  list_local = list;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_40,(basic_string_view<char,_std::char_traits<char>_> *)&list_local,
             &local_41);
  psVar1 = append((string *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return psVar1;
}

Assistant:

std::string& cmList::append(std::string& list, cm::string_view value)
{
  return cmList::append(list, std::string{ value });
}